

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O2

void __thiscall CSocekt::flyd_wait_request_handler(CSocekt *this,lp_connection_t c)

{
  uint uVar1;
  ulong v;
  self *psVar2;
  LogStream *pLVar3;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  undefined1 local_1050 [12];
  undefined1 local_1040 [12];
  undefined1 local_1030 [12];
  undefined1 local_1020 [12];
  undefined1 local_1010 [12];
  Logger local_1000;
  
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<108>
              ((SourceFile *)local_1010,
               (char (*) [108])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1010._0_8_;
    file.size_ = local_1010._8_4_;
    muduo::Logger::Logger(&local_1000,file,0x18);
    muduo::LogStream::operator<<(&local_1000.impl_.stream_,anon_var_dwarf_30cd0);
    muduo::Logger::~Logger(&local_1000);
  }
  v = recvproc(this,c,c->precvbuf,(ulong)c->irecvlen);
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<108>
              ((SourceFile *)local_1020,
               (char (*) [108])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
              );
    file_00._12_4_ = 0;
    file_00.data_ = (char *)local_1020._0_8_;
    file_00.size_ = local_1020._8_4_;
    muduo::Logger::Logger(&local_1000,file_00,0x1c);
    psVar2 = muduo::LogStream::operator<<(&local_1000.impl_.stream_,anon_var_dwarf_30ce6);
    pLVar3 = muduo::LogStream::operator<<(psVar2,c->irecvlen);
    psVar2 = muduo::LogStream::operator<<(pLVar3,anon_var_dwarf_30cfc);
    psVar2 = muduo::LogStream::operator<<(psVar2,anon_var_dwarf_30d12);
    pLVar3 = muduo::LogStream::operator<<(psVar2,v);
    muduo::LogStream::operator<<(pLVar3,anon_var_dwarf_30cfc);
    muduo::Logger::~Logger(&local_1000);
  }
  if ((long)v < 1) {
    return;
  }
  switch(c->curStat) {
  case '\0':
    if (v != this->m_iLenPkgHeader) {
      if (muduo::g_logLevel < 3) {
        muduo::Logger::SourceFile::SourceFile<108>
                  ((SourceFile *)local_1040,
                   (char (*) [108])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
                  );
        file_03._12_4_ = 0;
        file_03.data_ = (char *)local_1040._0_8_;
        file_03.size_ = local_1040._8_4_;
        muduo::Logger::Logger(&local_1000,file_03,0x2c);
        muduo::LogStream::operator<<(&local_1000.impl_.stream_,anon_var_dwarf_30d32);
        muduo::Logger::~Logger(&local_1000);
      }
      c->curStat = '\x01';
      c->precvbuf = c->precvbuf + v;
      c->irecvlen = c->irecvlen - (int)v;
      return;
    }
    if (muduo::g_logLevel < 3) {
      muduo::Logger::SourceFile::SourceFile<108>
                ((SourceFile *)local_1030,
                 (char (*) [108])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
                );
      file_01._12_4_ = 0;
      file_01.data_ = (char *)local_1030._0_8_;
      file_01.size_ = local_1030._8_4_;
      muduo::Logger::Logger(&local_1000,file_01,0x27);
      muduo::LogStream::operator<<(&local_1000.impl_.stream_,anon_var_dwarf_30d1c);
      muduo::Logger::~Logger(&local_1000);
    }
    break;
  case '\x01':
    if (muduo::g_logLevel < 3) {
      muduo::Logger::SourceFile::SourceFile<108>
                ((SourceFile *)local_1050,
                 (char (*) [108])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/net/flyd_socket_request.cc"
                );
      file_02._12_4_ = 0;
      file_02.data_ = (char *)local_1050._0_8_;
      file_02.size_ = local_1050._8_4_;
      muduo::Logger::Logger(&local_1000,file_02,0x35);
      muduo::LogStream::operator<<(&local_1000.impl_.stream_,anon_var_dwarf_30d3c);
      muduo::Logger::~Logger(&local_1000);
    }
    uVar1 = c->irecvlen;
    if (v != uVar1) {
      c->curStat = '\x01';
      goto LAB_001195c5;
    }
    break;
  case '\x02':
    uVar1 = c->irecvlen;
    if (v == uVar1) {
LAB_001194f1:
      flyd_wait_request_handler_proc_plast(this,c);
      return;
    }
    c->curStat = '\x03';
    goto LAB_001195c5;
  case '\x03':
    uVar1 = c->irecvlen;
    if (v == uVar1) goto LAB_001194f1;
LAB_001195c5:
    c->precvbuf = c->precvbuf + v;
    c->irecvlen = uVar1 - (int)v;
  default:
    goto switchD_0011946d_default;
  }
  flyd_wait_request_handler_proc_p1(this,c);
switchD_0011946d_default:
  return;
}

Assistant:

void CSocekt::flyd_wait_request_handler(lp_connection_t c)
{
    LOG_INFO << "调用了flyd_wait_request_handler函数";
    //收包，注意我们用的第二个和第三个参数，我们用的始终是这两个参数，因此我们必须保证 c->precvbuf指向正确的收包位置，保证c->irecvlen指向正确的收包宽度
    
    ssize_t reco = recvproc(c,c->precvbuf,c->irecvlen);
    LOG_INFO << "要接收" << c->irecvlen << "字节" << "收到" << reco << "字节";
    if(reco <= 0)
    {
        return;//该处理的上边这个recvproc()函数处理过了，这里<=0是直接return
    }

    //走到这里，说明成功收到了一些字节（>0），就要开始判断收到了多少数据了
    if(c->curStat == _PKG_HD_INIT) //连接建立起来时肯定是这个状态，因为在ngx_get_connection()中已经把curStat成员赋值成_PKG_HD_INIT了
    {
        if(reco == m_iLenPkgHeader)//正好收到完整包头，这里拆解包头
        {
            LOG_INFO << "完整的包头";
            flyd_wait_request_handler_proc_p1(c); //那就调用专门针对包头处理完整的函数去处理把。
        }
        else
        {
             LOG_INFO << "包头不完整";
            //收到的包头不完整--我们不能预料每个包的长度，也不能预料各种拆包/粘包情况，所以收到不完整包头【也算是缺包】是很可能的；
            c->curStat        = _PKG_HD_RECVING;                 //接收包头中，包头不完整，继续接收包头中
            c->precvbuf       = c->precvbuf + reco;              //注意收后续包的内存往后走
            c->irecvlen       = c->irecvlen - reco;              //要收的内容当然要减少，以确保只收到完整的包头先
        } //end  if(reco == m_iLenPkgHeader)
    }
    else if(c->curStat == _PKG_HD_RECVING) //接收包头中，包头不完整，继续接收中，这个条件才会成立
    {
        LOG_INFO << "接收包头中...";
        if(c->irecvlen == reco) //要求收到的宽度和我实际收到的宽度相等
        {
            //包头收完整了
            flyd_wait_request_handler_proc_p1(c); //那就调用专门针对包头处理完整的函数去处理把。
        }
        else
        {
            //包头还是没收完整，继续收包头
            c->curStat        = _PKG_HD_RECVING;                 //没必要
            c->precvbuf       = c->precvbuf + reco;              //注意收后续包的内存往后走
            c->irecvlen       = c->irecvlen - reco;              //要收的内容当然要减少，以确保只收到完整的包头先
        }
    }
    else if(c->curStat == _PKG_BD_INIT)
    {
        //包头刚好收完，准备接收包体
        if(reco == c->irecvlen)
        {
            //收到的宽度等于要收的宽度，包体也收完整了
            flyd_wait_request_handler_proc_plast(c);
        }
        else
        {
            //收到的宽度小于要收的宽度
            c->curStat = _PKG_BD_RECVING;
            c->precvbuf = c->precvbuf + reco;
            c->irecvlen = c->irecvlen - reco;
        }
    }
    else if(c->curStat == _PKG_BD_RECVING)
    {
        //接收包体中，包体不完整，继续接收中
        if(c->irecvlen == reco)
        {
            //包体收完整了
            flyd_wait_request_handler_proc_plast(c);
        }
        else
        {
            //包体没收完整，继续收
            c->precvbuf = c->precvbuf + reco;
            c->irecvlen = c->irecvlen - reco;
        }
    }  //end if(c->curStat == _PKG_HD_INIT)

}